

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O0

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_dileave3_reverses_ileave3_::run
          (Test_bitileave_dileave3_reverses_ileave3_ *this)

{
  SourceLocation loc;
  bool bVar1;
  result_type_conflict args;
  result_type_conflict args_1;
  result_type_conflict args_2;
  enable_if_t<areUnsigned<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_long_long> n;
  enable_if_t<isStringifieable<unsigned_int[3]>,_std::string> local_14d0;
  undefined1 local_14ae;
  undefined1 local_14ad;
  undefined1 local_1499;
  enable_if_t<isStringifieable<unsigned_int[3]>,_std::string> local_1498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1418;
  string_view local_13f8;
  undefined4 local_13e4;
  uint (*pauStack_13e0) [3];
  Cmp cmp_;
  uint32_t (*tr_) [3];
  uint32_t (*tl_) [3];
  uint uStack_13c8;
  uint32_t actual [3];
  uint32_t expected [3];
  result_type_conflict z;
  result_type_conflict y;
  result_type_conflict x;
  size_t i;
  uniform_int_distribution<unsigned_int> distr;
  mt19937 rng;
  Test_bitileave_dileave3_reverses_ileave3_ *this_local;
  
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&distr,0x3039);
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_int> *)&i,0,0x200000);
  _y = 0;
  while( true ) {
    if (0x3ff < _y) {
      return;
    }
    args = std::uniform_int_distribution<unsigned_int>::operator()
                     ((uniform_int_distribution<unsigned_int> *)&i,
                      (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                       *)&distr);
    args_1 = std::uniform_int_distribution<unsigned_int>::operator()
                       ((uniform_int_distribution<unsigned_int> *)&i,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)&distr);
    args_2 = std::uniform_int_distribution<unsigned_int>::operator()
                       ((uniform_int_distribution<unsigned_int> *)&i,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)&distr);
    actual[1] = args;
    actual[2] = args_1;
    n = ileave<unsigned_int,unsigned_int,unsigned_int>(args,args_1,args_2);
    detail::dileave_naive<unsigned_int,_unsigned_int,_unsigned_int>
              (n,(uint *)((long)&tl_ + 4),&uStack_13c8,actual);
    tr_ = (uint32_t (*) [3])((long)&tl_ + 4);
    pauStack_13e0 = (uint (*) [3])(actual + 1);
    local_13e4 = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_int,unsigned_int,3ul>
                      ((uint (*) [3])tr_,pauStack_13e0);
    local_1499 = 0;
    local_14ad = 0;
    local_14ae = 0;
    if (!bVar1) break;
    local_1499 = 0;
    local_14ad = 0;
    local_14ae = 0;
    _y = _y + 1;
  }
  stringify<unsigned_int[3]>(&local_1498,(uint (*) [3])tr_);
  local_1499 = 1;
  std::operator+(&local_1478,"Comparison failed: actual == expected (with \"actual\"=",&local_1498);
  local_14ad = 1;
  std::operator+(&local_1458,&local_1478,", \"expected\"=");
  local_14ae = 1;
  stringify<unsigned_int[3]>(&local_14d0,pauStack_13e0);
  std::operator+(&local_1438,&local_1458,&local_14d0);
  std::operator+(&local_1418,&local_1438,")");
  local_13f8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1418);
  loc.function = "run";
  loc.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  loc.line = 0x111;
  assertFail(local_13f8,loc);
}

Assistant:

BITMANIP_TEST(bitileave, dileave3_reverses_ileave3)
{
    std::mt19937 rng{12345};
    std::uniform_int_distribution<std::uint32_t> distr{0, 1u << 21};

    for (size_t i = 0; i < 1024 * 1; ++i) {
        const auto x = distr(rng), y = distr(rng), z = distr(rng);
        std::uint32_t expected[] = {x, y, z};
        std::uint32_t actual[3];
        detail::dileave_naive(ileave(x, y, z), actual[0], actual[1], actual[2]);
        BITMANIP_ASSERT_EQ(actual, expected);
    }
}